

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CountProximity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double distance;
  int selector;
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  char *pcVar4;
  PClass *ti;
  AActor *origin;
  
  if (numret < 1) {
    return 0;
  }
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003d8668;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d864f:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d8668:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x2c9,
                  "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003d8531;
    bVar1 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d8668;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003d864f;
LAB_003d8531:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003d8687;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003d8658:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d8687:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x2ca,
                  "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  ti = (PClass *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (ti == (PClass *)0x0) goto LAB_003d8589;
    bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,ti);
    if (!bVar1) {
      pcVar4 = "classname == NULL || classname->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d8687;
    }
  }
  else {
    if (ti != (PClass *)0x0) goto LAB_003d8658;
LAB_003d8589:
    ti = (PClass *)0x0;
  }
  if ((uint)numparam < 3) {
    pcVar4 = "(paramnum) < numparam";
LAB_003d86af:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x2cb,
                  "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003d86af;
  }
  distance = param[2].field_0.f;
  if (numparam == 3) {
    param = defaultparam->Array;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d86f6:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2cc,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = param[3].field_0.i;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d86f6;
    }
    iVar2 = param[3].field_0.i;
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003d86ce;
      }
      goto LAB_003d85ff;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d86ce:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x2cd,
                  "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003d85ff:
  selector = param[4].field_0.i;
  pAVar3 = COPY_AAPTR(origin,selector);
  if (pAVar3 == (AActor *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = P_Thing_CheckProximity(origin,ti,distance,0,iVar2,selector,true);
  }
  VMReturn::SetInt(ret,iVar2);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CountProximity)
{
	if (numret > 0)
	{
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS(classname, AActor);
		PARAM_FLOAT(distance);
		PARAM_INT_DEF(flags);
		PARAM_INT_DEF(ptr);

		AActor *mobj = COPY_AAPTR(self, ptr);
		if (mobj == nullptr)
		{
			ret->SetInt(0);
		}
		else
		{
			ret->SetInt(P_Thing_CheckProximity(self, classname, distance, 0, flags, ptr, true));
		}
		return 1;
	}
	return 0;
}